

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

void Gia_ManCheckFalseOne
               (Gia_Man_t *p,int iOut,int nTimeOut,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  abctime aVar4;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar5;
  sat_solver *s;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_03;
  int iVar0;
  abctime time;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar;
  uint uVar11;
  char *pStr;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  undefined8 in_stack_ffffffffffffff38;
  int iFanin;
  
  uVar10 = (ulong)(uint)fVerbose;
  pObj = Gia_ManCo(p,iOut);
  p_00 = Vec_IntAlloc(p->nLevels);
  p_01 = Gia_ManCollectPath(p,pObj);
  aVar4 = Abc_Clock();
  iFanin = Gia_ObjFaninId0p(p,pObj);
  p_02 = Gia_ManCollectNodesCis(p,&iFanin,1);
  iVar2 = p_02->nSize;
  iVar15 = -1;
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_02,iVar8);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = p_02->nSize;
    pGVar5->Value = iVar15 + iVar2;
    iVar15 = iVar15 + -1;
  }
  if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pPivot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                  ,0xb6,"void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
  }
  s = sat_solver_new();
  iVar2 = 0;
  if (nTimeOut == 0) {
    aVar6 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    aVar6 = aVar6 + (long)nTimeOut * 1000000;
  }
  s->nRuntimeLimit = aVar6;
  uVar3 = p_01->nSize;
  iVar1 = uVar3 * 3;
  sat_solver_setnvars(s,iVar1 + p_02->nSize * 2);
  iVar8 = p_02->nSize;
  iVar15 = iVar8 + iVar1;
  for (; iVar2 < iVar8; iVar2 = iVar2 + 1) {
    iVar8 = Vec_IntEntry(p_02,iVar2);
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar14 = *(ulong *)pGVar5;
    if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
      sat_solver_add_and(s,pGVar5->Value + iVar1,pGVar5[-(uVar14 & 0x1fffffff)].Value + iVar1,
                         pGVar5[-(uVar14 >> 0x20 & 0x1fffffff)].Value + iVar1,
                         (uint)(uVar14 >> 0x1d) & 1,(uint)(uVar14 >> 0x3d) & 1,
                         (int)in_stack_ffffffffffffff38);
      uVar14 = *(ulong *)pGVar5;
      uVar12 = (uint)(uVar14 >> 0x1d) & 1;
      uVar10 = (ulong)uVar12;
      sat_solver_add_and(s,pGVar5->Value + iVar15,pGVar5[-(uVar14 & 0x1fffffff)].Value + iVar15,
                         pGVar5[-(uVar14 >> 0x20 & 0x1fffffff)].Value + iVar15,uVar12,
                         (uint)(uVar14 >> 0x3d) & 1,(int)in_stack_ffffffffffffff38);
    }
    iVar8 = p_02->nSize;
  }
  uVar9 = 0;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = uVar3;
  }
  iVar2 = uVar3 * 2 + -1;
  for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    iVar8 = Vec_IntEntry(p_01,uVar9);
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar13 = (uint)*(undefined8 *)pGVar5;
    uVar11 = uVar9;
    if ((~uVar13 & 0x1fffffff) == 0 || (int)uVar13 < 0) {
      if ((~uVar13 & 0x9fffffff) != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                      ,0xe7,
                      "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
      }
      sat_solver_add_xor(s,uVar9,pGVar5->Value + iVar1,pGVar5->Value + iVar15,(int)uVar10);
    }
    else {
      if (uVar9 == 0) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                      ,0xce,
                      "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
      }
      iVar8 = Vec_IntEntry(p_01,uVar9 - 1);
      pGVar7 = Gia_ManObj(p,iVar8);
      uVar10 = *(ulong *)pGVar5;
      uVar13 = (uint)(uVar10 >> 0x20);
      if (pGVar7 == pGVar5 + -(ulong)((uint)uVar10 & 0x1fffffff)) {
        sat_solver_add_and(s,uVar3 + uVar9,(uVar3 - 1) + uVar9,
                           pGVar5[-(uVar10 >> 0x20 & 0x1fffffff)].Value + iVar1,
                           (uint)(uVar10 >> 0x1d) & 1,uVar13 >> 0x1d & 1,
                           (int)in_stack_ffffffffffffff38);
        iVar0 = iVar2 + uVar9;
        uVar14 = *(ulong *)pGVar5;
        iVar8 = pGVar5[-(uVar14 >> 0x20 & 0x1fffffff)].Value + iVar15;
      }
      else {
        if (pGVar7 != pGVar5 + -(ulong)(uVar13 & 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                        ,0xe2,
                        "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)");
        }
        sat_solver_add_and(s,uVar9 + uVar3,pGVar5[-(ulong)((uint)uVar10 & 0x1fffffff)].Value + iVar1
                           ,(uVar3 - 1) + uVar9,(uint)(uVar10 >> 0x1d) & 1,uVar13 >> 0x1d & 1,
                           (int)in_stack_ffffffffffffff38);
        uVar14 = *(ulong *)pGVar5;
        iVar0 = pGVar5[-(ulong)((uint)uVar14 & 0x1fffffff)].Value + iVar15;
        iVar8 = iVar2 + uVar9;
      }
      iVar = uVar9 + uVar3 * 2;
      uVar13 = (uint)(uVar14 >> 0x1d) & 1;
      uVar10 = (ulong)uVar13;
      sat_solver_add_and(s,iVar,iVar0,iVar8,uVar13,(uint)(uVar14 >> 0x3d) & 1,
                         (int)in_stack_ffffffffffffff38);
      sat_solver_add_xor(s,uVar9,uVar9 + uVar3,iVar,(int)uVar10);
    }
    iVar8 = Abc_Var2Lit(uVar9,uVar11);
    Vec_IntPush(p_00,iVar8);
  }
  piVar16 = (int *)0x0;
  iVar2 = sat_solver_solve(s,p_00->pArray,p_00->pArray + p_00->nSize,(long)nTimeOut,0,0,0);
  uVar12 = 0;
  if (iVar2 == -1) {
    piVar16 = (s->conf_final).ptr;
    uVar12 = (s->conf_final).size;
    iVar15 = Abc_Lit2Var(piVar16[(long)(int)uVar12 + -1]);
    uVar9 = Abc_Lit2Var(*piVar16);
    if ((int)(uVar9 - iVar15) < 0x14) {
      uVar13 = iVar15 + -1 + (uint)(iVar15 == 0);
      uVar11 = uVar13;
      do {
        if (uVar9 < uVar11) {
          iVar15 = Vec_IntEntry(p_01,uVar9);
          p_03 = Vec_WecEntry(vHooks,iVar15);
          for (; uVar13 <= uVar9; uVar13 = uVar13 + 1) {
            iVar15 = Vec_IntEntry(p_01,uVar13);
            Vec_IntPush(p_03,iVar15);
          }
          break;
        }
        iVar15 = Vec_IntEntry(p_01,uVar11);
        iVar15 = Vec_WecLevelSize(vHooks,iVar15);
        uVar11 = uVar11 + 1;
      } while (iVar15 < 1);
    }
  }
  if (fVerbose != 0) {
    uVar9 = Gia_ObjLevel(p,pObj);
    pStr = (char *)(ulong)(uint)iOut;
    printf("PO %6d : Level = %3d  ",pStr,(ulong)uVar9);
    if (iVar2 == 1) {
      printf("There is no false path. ");
    }
    else if (iVar2 == 0) {
      pStr = (char *)(ulong)(uint)nTimeOut;
      printf("Timeout reached after %d seconds. ");
    }
    else {
      printf("False path contains %d nodes (out of %d):  ",(ulong)uVar12,(ulong)uVar3);
      iVar2 = Abc_Lit2Var(*piVar16);
      uVar3 = Vec_IntEntry(p_01,iVar2);
      pStr = (char *)(ulong)uVar3;
      printf("top = %d  ");
      if (fVeryVerbose != 0) {
        uVar10 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar10 = 0;
        }
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          uVar3 = Abc_Lit2Var(piVar16[uVar14]);
          pStr = (char *)(ulong)uVar3;
          printf("%d ");
        }
      }
      printf("  ");
    }
    aVar6 = Abc_Clock();
    Abc_PrintTime((int)aVar6 - (int)aVar4,pStr,time);
  }
  sat_solver_delete(s);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManCheckFalseOne( Gia_Man_t * p, int iOut, int nTimeOut, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pPivot = Gia_ManCo( p, iOut );
    Vec_Int_t * vLits = Vec_IntAlloc( p->nLevels );
    Vec_Int_t * vPath = Gia_ManCollectPath( p, pPivot );
    int nLits = 0, * pLits = NULL;
    int i, Shift[2], status;
    abctime clkStart = Abc_Clock();
    // collect objects and assign SAT variables
    int iFanin = Gia_ObjFaninId0p( p, pPivot );
    Vec_Int_t * vObjs = Gia_ManCollectNodesCis( p, &iFanin, 1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->Value = Vec_IntSize(vObjs) - 1 - i;
    assert( Gia_ObjIsCo(pPivot) );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_setnvars( pSat, 3 * Vec_IntSize(vPath) + 2 * Vec_IntSize(vObjs) );
    Shift[0] = 3 * Vec_IntSize(vPath);
    Shift[1] = 3 * Vec_IntSize(vPath) + Vec_IntSize(vObjs);
    // add CNF for the cone
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        sat_solver_add_and( pSat, pObj->Value + Shift[0], 
            Gia_ObjFanin0(pObj)->Value + Shift[0], Gia_ObjFanin1(pObj)->Value + Shift[0], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
        sat_solver_add_and( pSat, pObj->Value + Shift[1], 
            Gia_ObjFanin0(pObj)->Value + Shift[1], Gia_ObjFanin1(pObj)->Value + Shift[1], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
    }
    // add CNF for the path
    Gia_ManForEachObjVec( vPath, p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            assert( i > 0 );
            pFanin = Gia_ManObj( p, Vec_IntEntry(vPath, i-1) );
            if ( pFanin == Gia_ObjFanin0(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    i-1 + 1*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[0], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    i-1 + 2*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[1], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else if ( pFanin == Gia_ObjFanin1(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[0], i-1 + 1*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[1], i-1 + 2*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else assert( 0 );
            sat_solver_add_xor( pSat, i, i + 1*Vec_IntSize(vPath), i + 2*Vec_IntSize(vPath), 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
            sat_solver_add_xor( pSat, i, pObj->Value + Shift[0], pObj->Value + Shift[1], 0 );
        else assert( 0 );
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
    }
    // call the SAT solver
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)nTimeOut, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        int iBeg, iEnd;
        nLits = sat_solver_final( pSat, &pLits );
        iBeg  = Abc_Lit2Var(pLits[nLits-1]);
        iEnd  = Abc_Lit2Var(pLits[0]);
        if ( iEnd - iBeg < 20 )
        {
            // check if nodes on the path are already used
            for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                if ( Vec_WecLevelSize(vHooks, Vec_IntEntry(vPath, i)) > 0 )
                    break;
            if ( i > iEnd )
            {
                Vec_Int_t * vHook = Vec_WecEntry(vHooks, Vec_IntEntry(vPath, iEnd));
                for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                    Vec_IntPush( vHook, Vec_IntEntry(vPath, i) );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "PO %6d : Level = %3d  ", iOut, Gia_ObjLevel(p, pPivot) );
        if ( status == l_Undef )
            printf( "Timeout reached after %d seconds. ", nTimeOut );
        else if ( status == l_True )
            printf( "There is no false path. " );
        else
        {
            printf( "False path contains %d nodes (out of %d):  ", nLits, Vec_IntSize(vPath) );
            printf( "top = %d  ", Vec_IntEntry(vPath, Abc_Lit2Var(pLits[0])) );
            if ( fVeryVerbose )
                for ( i = 0; i < nLits; i++ )
                    printf( "%d ", Abc_Lit2Var(pLits[i]) );
            printf( "  " );
        }
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vObjs );
    Vec_IntFree( vPath );
    Vec_IntFree( vLits );
}